

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUmdTranslationTable.h
# Opt level: O0

void __thiscall GmmLib::AuxTable::AuxTable(AuxTable *this,GmmClientContext *pClientContextIn)

{
  int iVar1;
  undefined4 extraout_var;
  WA_TABLE *pWVar2;
  undefined4 extraout_var_00;
  bool bVar3;
  GmmClientContext *pClientContextIn_local;
  AuxTable *this_local;
  
  PageTable::PageTable(&this->super_PageTable,0x8000,0x1000,AUXTT);
  iVar1 = (*pClientContextIn->_vptr_GmmClientContext[3])();
  pWVar2 = Context::GetWaTable((Context *)CONCAT44(extraout_var,iVar1));
  bVar3 = true;
  if ((*(uint *)&pWVar2->field_0x8 >> 0xe & 1) == 0) {
    iVar1 = (*pClientContextIn->_vptr_GmmClientContext[3])();
    pWVar2 = Context::GetWaTable((Context *)CONCAT44(extraout_var_00,iVar1));
    bVar3 = (*(uint *)&pWVar2->field_0x8 >> 0xf & 1) != 0;
  }
  iVar1 = 0x1000;
  if (bVar3) {
    iVar1 = 0x2000;
  }
  this->L1Size = iVar1;
  this->NullL2Table = (Table *)0x0;
  this->NullL1Table = (Table *)0x0;
  this->NullCCSTile = 0;
  return;
}

Assistant:

AuxTable(GmmClientContext *pClientContextIn)
            : PageTable(8 * PAGE_SIZE, GMM_AUX_L3_SIZE, TT_TYPE::AUXTT), L1Size((WA16K(pClientContextIn->GetLibContext()) || WA64K(pClientContextIn->GetLibContext())) ? (2 * PAGE_SIZE) : PAGE_SIZE)
        {
            NullL2Table = nullptr;
            NullL1Table = nullptr;
            NullCCSTile = 0;
        }